

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::request_append_entries(raft_server *this)

{
  int32 iVar1;
  uint64_t target_idx;
  _Hash_node_base *p_Var2;
  ptr<peer> local_30;
  
  if ((this->peers_)._M_h._M_element_count != 0) {
    iVar1 = get_quorum_for_commit(this);
    if (iVar1 != 0) {
      p_Var2 = (this->peers_)._M_h._M_before_begin._M_nxt;
      if (p_Var2 != (_Hash_node_base *)0x0) {
        do {
          local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var2[2]._M_nxt;
          local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[3]._M_nxt;
          if (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          request_append_entries(this,&local_30);
          if (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_30.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var2 = p_Var2->_M_nxt;
        } while (p_Var2 != (_Hash_node_base *)0x0);
      }
      return;
    }
  }
  target_idx = get_current_leader_index(this);
  commit(this,target_idx);
  return;
}

Assistant:

void raft_server::request_append_entries() {
    // Special case:
    //   1) one-node cluster, OR
    //   2) quorum size == 1 (including leader).
    //
    // In those cases, we may not enter `handle_append_entries_resp`,
    // which calls `commit()` function.
    // We should call it here.
    if ( peers_.size() == 0 ||
         get_quorum_for_commit() == 0 ) {
        uint64_t leader_index = get_current_leader_index();
        commit(leader_index);
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        request_append_entries(it->second);
    }
}